

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::AutomakeReporter::testCaseEnded(AutomakeReporter *this,TestCaseStats *_testCaseStats)

{
  uint64_t uVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,":test-result: ",0xe);
  if ((_testCaseStats->totals).testCases.skipped == 0) {
    uVar1 = (_testCaseStats->totals).assertions.failed;
    if ((_testCaseStats->totals).assertions.failedButOk == 0 && uVar1 == 0) {
      if ((_testCaseStats->totals).assertions.skipped != 0) {
LAB_0015d48e:
        poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
        pcVar4 = "XFAIL";
        lVar3 = 5;
        goto LAB_0015d406;
      }
      poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
      pcVar4 = "PASS";
    }
    else {
      if (uVar1 == 0) goto LAB_0015d48e;
      poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
      pcVar4 = "FAIL";
    }
  }
  else {
    poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pcVar4 = "SKIP";
  }
  lVar3 = 4;
LAB_0015d406:
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  uStack_18._0_7_ = CONCAT16(0x20,(undefined6)uStack_18);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                      (char *)((long)&uStack_18 + 6),1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(_testCaseStats->testInfo->name)._M_dataplus._M_p,
                      (_testCaseStats->testInfo->name)._M_string_length);
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_18 + 7),1);
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  return;
}

Assistant:

void AutomakeReporter::testCaseEnded(TestCaseStats const& _testCaseStats) {
        // Possible values to emit are PASS, XFAIL, SKIP, FAIL, XPASS and ERROR.
        m_stream << ":test-result: ";
        if ( _testCaseStats.totals.testCases.skipped > 0 ) {
            m_stream << "SKIP";
        } else if (_testCaseStats.totals.assertions.allPassed()) {
            m_stream << "PASS";
        } else if (_testCaseStats.totals.assertions.allOk()) {
            m_stream << "XFAIL";
        } else {
            m_stream << "FAIL";
        }
        m_stream << ' ' << _testCaseStats.testInfo->name << '\n';
        StreamingReporterBase::testCaseEnded(_testCaseStats);
    }